

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * dmrC_primary_expression(dmr_C *C,token *token,expression **tree)

{
  expression *peVar1;
  token *ptVar2;
  int iVar3;
  anon_union_8_7_c7bfca54_for_token_2 *local_48;
  token *next;
  symbol *sym;
  expression *expr;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  sym = (symbol *)0x0;
  expr = (expression *)tree;
  tree_local = (expression **)token;
  token_local = (token *)C;
  switch(*(uint *)&token->pos & 0x3f) {
  case 2:
    next = (token *)dmrC_lookup_symbol((token->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    peVar1 = tree_local[1];
    if ((symbol *)next == (symbol *)0x0) {
      next = (token *)handle_func((dmr_C *)token_local,(token *)tree_local);
      if (tree_local[2] == (expression *)token_local->next[0x174].field_2.number) {
        tree_local = (expression **)
                     builtin_types_compatible_p_expr
                               ((dmr_C *)token_local,(token *)tree_local,(expression **)&sym);
        break;
      }
      if (*(position *)(tree_local + 2) == token_local->next[0x175].pos) {
        tree_local = (expression **)
                     builtin_offsetof_expr
                               ((dmr_C *)token_local,(token *)tree_local,(expression **)&sym);
        break;
      }
    }
    else if ((*(uint *)next >> 0x14 & 1) != 0) {
      sym = (symbol *)dmrC_alloc_expression((dmr_C *)token_local,(position)*tree_local,1);
      memcpy(sym,(((symbol *)next)->field_14).field_2.initializer,0x40);
      *(expression **)&(sym->pos).field_0x4 = *tree_local;
      *(ushort *)sym = *(ushort *)sym & 0xff | 0x100;
      tree_local = (expression **)peVar1;
      break;
    }
    sym = (symbol *)dmrC_alloc_expression((dmr_C *)token_local,(position)*tree_local,3);
    if ((next != (token *)0x0) && ((*(uint *)&next->pos >> 8 & 0x1ff) == 2)) {
      dmrC_sparse_error((dmr_C *)token_local,(position)*tree_local,"typename in expression");
      next = (token *)0x0;
    }
    sym->replace = (symbol *)tree_local[2];
    sym->next_id = (symbol *)next;
    tree_local = (expression **)peVar1;
    break;
  case 3:
    sym = (symbol *)dmrC_alloc_expression(C,token->pos,3);
    *(ushort *)sym = *(ushort *)sym & 0xff | 0x100;
    *(anon_union_8_7_c7bfca54_for_token_2 **)&(sym->endpos).field_0x4 =
         &token_local->next[0x6a].field_2;
    (((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->field_3).unop =
         (expression *)&token_local->next[0x13f].next;
    sym->replace = (symbol *)tree_local[2];
    tree_local = (expression **)tree_local[1];
    break;
  case 4:
    sym = (symbol *)dmrC_alloc_expression(C,token->pos,1);
    get_number_value((dmr_C *)token_local,(expression *)sym,(token *)tree_local);
    tree_local = (expression **)tree_local[1];
    break;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    sym = (symbol *)dmrC_alloc_expression(C,token->pos,1);
    *(ushort *)sym = *(ushort *)sym & 0xff | 0x100;
    if (((uint)*tree_local & 0x3f) < 10) {
      ptVar2 = token_local->next + 0x6a;
    }
    else {
      ptVar2 = token_local->next + 0x87;
    }
    local_48 = &ptVar2->field_2;
    *(anon_union_8_7_c7bfca54_for_token_2 **)&(sym->endpos).field_0x4 = local_48;
    dmrC_get_char_constant
              ((dmr_C *)token_local,(token *)tree_local,
               (unsigned_long_long *)
               &((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->statement);
    tree_local = (expression **)tree_local[1];
    break;
  case 0xf:
  case 0x10:
    sym = (symbol *)dmrC_alloc_expression(C,token->pos,2);
    tree_local = (expression **)
                 dmrC_get_string_constant
                           ((dmr_C *)token_local,(token *)tree_local,(expression *)sym);
    break;
  case 0x11:
    if ((token->field_2).special == 0x28) {
      sym = (symbol *)dmrC_alloc_expression(C,token->pos,9);
      *(int *)&sym->pos = 0x28;
      tree_local = (expression **)
                   dmrC_parens_expression
                             ((dmr_C *)token_local,(token *)tree_local,
                              (expression **)
                              &((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->
                               statement,"in expression");
      if (sym->next_id != (symbol *)0x0) {
        *(ushort *)sym = *(ushort *)sym & 0xff | *(ushort *)sym->next_id & 0xff00;
      }
    }
    else if (((token->field_2).special == 0x5b) &&
            (iVar3 = dmrC_lookup_type(token->next), iVar3 != 0)) {
      sym = (symbol *)dmrC_alloc_expression((dmr_C *)token_local,(position)*tree_local,4);
      *(ushort *)sym = *(ushort *)sym & 0xff | 0x100;
      tree_local = (expression **)
                   dmrC_typename((dmr_C *)token_local,(token *)tree_local[1],
                                 (symbol **)
                                 &((anon_union_32_18_55d8ca1e_for_expression_5 *)&sym->next_id)->
                                  statement,(int *)0x0);
      tree_local = (expression **)
                   dmrC_expect_token((dmr_C *)token_local,(token *)tree_local,0x5d,
                                     "in type expression");
    }
  }
  *(symbol **)expr = sym;
  return (token *)tree_local;
}

Assistant:

struct token *dmrC_primary_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	struct expression *expr = NULL;

	switch (dmrC_token_type(token)) {
	case TOKEN_CHAR:
	case TOKEN_CHAR_EMBEDDED_0:
	case TOKEN_CHAR_EMBEDDED_1:
	case TOKEN_CHAR_EMBEDDED_2:
	case TOKEN_CHAR_EMBEDDED_3:
	case TOKEN_WIDE_CHAR:
	case TOKEN_WIDE_CHAR_EMBEDDED_0:
	case TOKEN_WIDE_CHAR_EMBEDDED_1:
	case TOKEN_WIDE_CHAR_EMBEDDED_2:
	case TOKEN_WIDE_CHAR_EMBEDDED_3:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);   
		expr->flags = Int_const_expr;
		expr->ctype = dmrC_token_type(token) < TOKEN_WIDE_CHAR ? &C->S->int_ctype : &C->S->long_ctype;
		dmrC_get_char_constant(C, token, &expr->value);
		token = token->next;
		break;

	case TOKEN_NUMBER:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
		get_number_value(C, expr, token); /* will see if it's an integer */
		token = token->next;
		break;

	case TOKEN_ZERO_IDENT: {
		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);
		expr->flags = Int_const_expr;
		expr->ctype = &C->S->int_ctype;
		expr->symbol = &C->S->zero_int;
		expr->symbol_name = token->ident;
		token = token->next;
		break;
	}

	case TOKEN_IDENT: {
		struct symbol *sym = dmrC_lookup_symbol(token->ident, NS_SYMBOL | NS_TYPEDEF);
		struct token *next = token->next;

		if (!sym) {
			sym = handle_func(C, token);
			if (token->ident == C->S->__builtin_types_compatible_p_ident) {
				token = builtin_types_compatible_p_expr(C, token, &expr);
				break;
			}
			if (token->ident == C->S->__builtin_offsetof_ident) {
				token = builtin_offsetof_expr(C, token, &expr);
				break;
			}
		} else if (sym->enum_member) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			*expr = *sym->initializer;
			/* we want the right position reported, thus the copy */
			expr->pos = token->pos;
			expr->flags = Int_const_expr;
			token = next;
			break;
		}

		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);

		/*
		 * We support types as real first-class citizens, with type
		 * comparisons etc:
		 *
		 *	if (typeof(a) == int) ..
		 */
		if (sym && sym->ns == NS_TYPEDEF) {
			dmrC_sparse_error(C, token->pos, "typename in expression");
			sym = NULL;
		}
		expr->symbol_name = token->ident;
		expr->symbol = sym;
		token = next;
		break;
	}

	case TOKEN_STRING:
	case TOKEN_WIDE_STRING:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_STRING);
		token = dmrC_get_string_constant(C, token, expr);
		break;

	case TOKEN_SPECIAL:
		if (token->special == '(') {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_PREOP);
			expr->op = '(';
			token = dmrC_parens_expression(C, token, &expr->unop, "in expression");
			if (expr->unop)
				expr->flags = expr->unop->flags;
			break;
		}
		if (token->special == '[' && dmrC_lookup_type(token->next)) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_TYPE);
			expr->flags = Int_const_expr; /* sic */
			token = dmrC_typename(C, token->next, &expr->symbol, NULL);
			token = dmrC_expect_token(C, token, ']', "in type expression");
			break;
		}
			
	default:
		;
	}
	*tree = expr;
	return token;
}